

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O2

void __thiscall Lodtalk::VMContext::executeDoIt(VMContext *this,string *code)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:34:21)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:34:21)>
             ::_M_manager;
  local_28._M_unused._M_object = code;
  withInterpreter(this,(WithInterpreterBlock *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void VMContext::executeDoIt(const std::string &code)
{
    withInterpreter([&](InterpreterProxy *interpreter) {
        Lodtalk::executeDoIt(interpreter, code);
    });
}